

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O2

void __thiscall QSqlTableModelPrivate::revertCachedRow(QSqlTableModelPrivate *this,int row)

{
  _Rb_tree_color _Var1;
  QExplicitlySharedDataPointer<QSqlRecordPrivate> this_00;
  uint uVar2;
  ModifiedRow *this_01;
  iterator iVar3;
  iterator iVar4;
  CacheMap *this_02;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_c8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  QSqlRecord local_98;
  undefined8 local_90;
  totally_ordered_wrapper<QSqlRecordPrivate_*> local_88;
  uint local_7c;
  undefined1 local_78 [32];
  undefined1 *local_58;
  QSqlRecord QStack_50;
  QSqlRecord local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00.d.ptr =
       *(totally_ordered_wrapper<QSqlRecordPrivate_*> *)
        &(this->super_QSqlQueryModelPrivate).field_0x8;
  this_02 = &this->cache;
  local_48.d.d.ptr = (QExplicitlySharedDataPointer<QSqlRecordPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QStack_50.d.d.ptr = (QExplicitlySharedDataPointer<QSqlRecordPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  local_7c = row;
  QSqlRecord::QSqlRecord(&local_98);
  ModifiedRow::ModifiedRow((ModifiedRow *)local_78,None,&local_98);
  QMap<int,_QSqlTableModelPrivate::ModifiedRow>::value
            ((ModifiedRow *)&local_58,this_02,(int *)&local_7c,(ModifiedRow *)local_78);
  ModifiedRow::~ModifiedRow((ModifiedRow *)local_78);
  QSqlRecord::~QSqlRecord(&local_98);
  if ((Op)local_58 - Update < 2) {
    if (puStack_40._0_1_ == false) {
      this_01 = QMap<int,_QSqlTableModelPrivate::ModifiedRow>::operator[](this_02,(int *)&local_7c);
      ModifiedRow::revert(this_01);
      uVar2 = local_7c;
      local_78._4_4_ = 0;
      local_78._0_4_ = local_7c;
      local_78._8_8_ = (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0;
      local_b0 = 0xffffffffffffffff;
      local_a8 = 0;
      uStack_a0 = 0;
      local_78._16_8_ = this_00.d.ptr;
      local_98.d.d.ptr._4_4_ = (**(code **)(*(long *)this_00.d.ptr + 0x80))(this_00.d.ptr);
      local_98.d.d.ptr._4_4_ = local_98.d.d.ptr._4_4_ + -1;
      local_98.d.d.ptr._0_4_ = uVar2;
      local_90 = 0;
      local_c8.d = (Data *)0x0;
      local_c8.ptr = (int *)0x0;
      local_c8.size = 0;
      local_88 = this_00.d.ptr;
      QAbstractItemModel::dataChanged
                ((QModelIndex *)this_00.d.ptr,(QModelIndex *)local_78,(QList *)&local_98);
      QArrayDataPointer<int>::~QArrayDataPointer(&local_c8);
    }
  }
  else if ((Op)local_58 == Insert) {
    iVar3 = QMap<int,_QSqlTableModelPrivate::ModifiedRow>::find(this_02,(int *)&local_7c);
    iVar4._M_node = (_Base_ptr)QMap<int,_QSqlTableModelPrivate::ModifiedRow>::end(this_02);
    if (iVar3.i._M_node != (iterator)iVar4._M_node) {
      local_78._0_8_ = (undefined1 *)0xffffffffffffffff;
      local_78._8_8_ = (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0;
      local_78._16_8_ = (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0;
      QSqlQueryModel::beginRemoveRows
                ((QSqlQueryModel *)this_00.d.ptr,(QModelIndex *)local_78,local_7c,local_7c);
      iVar4._M_node =
           (_Base_ptr)QMap<int,_QSqlTableModelPrivate::ModifiedRow>::erase(this_02,iVar3.i._M_node);
      while( true ) {
        iVar3 = QMap<int,_QSqlTableModelPrivate::ModifiedRow>::end(this_02);
        if ((iterator)iVar4._M_node == iVar3.i._M_node) break;
        _Var1 = iVar4._M_node[1]._M_color;
        local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        ModifiedRow::ModifiedRow((ModifiedRow *)local_78,(ModifiedRow *)&iVar4._M_node[1]._M_parent)
        ;
        QMap<int,_QSqlTableModelPrivate::ModifiedRow>::erase(this_02,(const_iterator)iVar4._M_node);
        local_98.d.d.ptr._0_4_ = _Var1 - _S_black;
        iVar3 = QMap<int,_QSqlTableModelPrivate::ModifiedRow>::insert
                          (this_02,(int *)&local_98,(ModifiedRow *)local_78);
        iVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar3.i._M_node);
        ModifiedRow::~ModifiedRow((ModifiedRow *)local_78);
      }
      QSqlQueryModel::endRemoveRows((QSqlQueryModel *)this_00.d.ptr);
    }
  }
  ModifiedRow::~ModifiedRow((ModifiedRow *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSqlTableModelPrivate::revertCachedRow(int row)
{
    Q_Q(QSqlTableModel);
    ModifiedRow r = cache.value(row);

    switch (r.op()) {
    case QSqlTableModelPrivate::None:
        Q_ASSERT_X(false, "QSqlTableModelPrivate::revertCachedRow()", "Invalid entry in cache map");
        return;
    case QSqlTableModelPrivate::Update:
    case QSqlTableModelPrivate::Delete:
        if (!r.submitted()) {
            cache[row].revert();
            emit q->dataChanged(q->createIndex(row, 0),
                                q->createIndex(row, q->columnCount() - 1));
        }
        break;
    case QSqlTableModelPrivate::Insert: {
            QMap<int, QSqlTableModelPrivate::ModifiedRow>::Iterator it = cache.find(row);
            if (it == cache.end())
                return;
            q->beginRemoveRows(QModelIndex(), row, row);
            it = cache.erase(it);
            while (it != cache.end()) {
                int oldKey = it.key();
                const QSqlTableModelPrivate::ModifiedRow oldValue = it.value();
                cache.erase(it);
                it = cache.insert(oldKey - 1, oldValue);
                ++it;
            }
            q->endRemoveRows();
        break; }
    }
}